

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_DUP_s(DisasContext_conflict1 *s,arg_DUP_s *a)

{
  uint32_t oprsz;
  uint vece;
  int iVar1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  undefined1 extraout_AL;
  TCGv_i64 in;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var2 = sve_access_check_aarch64(s);
  if (_Var2) {
    oprsz = s->sve_len;
    vece = a->esz;
    iVar1 = a->rd;
    in = cpu_reg_sp_aarch64(s,a->rn);
    tcg_gen_gvec_dup_i64_aarch64(tcg_ctx,vece,iVar1 * 0x100 + 0xc10,oprsz,oprsz,in);
    return (_Bool)extraout_AL;
  }
  return _Var2;
}

Assistant:

static bool trans_DUP_s(DisasContext *s, arg_DUP_s *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        tcg_gen_gvec_dup_i64(tcg_ctx, a->esz, vec_full_reg_offset(s, a->rd),
                             vsz, vsz, cpu_reg_sp(s, a->rn));
    }
    return true;
}